

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void mjs::accept<mjs::hoisting_visitor>(statement *s,hoisting_visitor *v)

{
  int iVar1;
  hoisting_visitor *v_local;
  statement *s_local;
  
  iVar1 = (*(s->super_syntax_node)._vptr_syntax_node[3])();
  switch(iVar1) {
  case 0:
    hoisting_visitor::operator()(v,(block_statement *)s);
    break;
  case 1:
    hoisting_visitor::operator()(v,(variable_statement *)s);
    break;
  case 2:
    hoisting_visitor::operator()(v,(debugger_statement *)s);
    break;
  case 3:
    hoisting_visitor::operator()(v,(empty_statement *)s);
    break;
  case 4:
    hoisting_visitor::operator()(v,(expression_statement *)s);
    break;
  case 5:
    hoisting_visitor::operator()(v,(if_statement *)s);
    break;
  case 6:
    hoisting_visitor::operator()(v,(do_statement *)s);
    break;
  case 7:
    hoisting_visitor::operator()(v,(while_statement *)s);
    break;
  case 8:
    hoisting_visitor::operator()(v,(for_statement *)s);
    break;
  case 9:
    hoisting_visitor::operator()(v,(for_in_statement *)s);
    break;
  case 10:
    hoisting_visitor::operator()(v,(continue_statement *)s);
    break;
  case 0xb:
    hoisting_visitor::operator()(v,(break_statement *)s);
    break;
  case 0xc:
    hoisting_visitor::operator()(v,(return_statement *)s);
    break;
  case 0xd:
    hoisting_visitor::operator()(v,(with_statement *)s);
    break;
  case 0xe:
    hoisting_visitor::operator()(v,(labelled_statement *)s);
    break;
  case 0xf:
    hoisting_visitor::operator()(v,(switch_statement *)s);
    break;
  case 0x10:
    hoisting_visitor::operator()(v,(throw_statement *)s);
    break;
  case 0x11:
    hoisting_visitor::operator()(v,(try_statement *)s);
    break;
  case 0x12:
    hoisting_visitor::operator()(v,(function_definition *)s);
    break;
  default:
    __assert_fail("!\"Not implemented\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                  0x3d6,
                  "auto mjs::accept(const statement &, Visitor &) [Visitor = mjs::hoisting_visitor]"
                 );
  }
  return;
}

Assistant:

auto accept(const statement& s, Visitor& v) {
    switch (s.type()) {
    case statement_type::block:                 return v(static_cast<const block_statement&>(s));
    case statement_type::variable:              return v(static_cast<const variable_statement&>(s));
    case statement_type::debugger:              return v(static_cast<const debugger_statement&>(s));
    case statement_type::empty:                 return v(static_cast<const empty_statement&>(s));
    case statement_type::expression:            return v(static_cast<const expression_statement&>(s));
    case statement_type::if_:                   return v(static_cast<const if_statement&>(s));
    case statement_type::do_:                   return v(static_cast<const do_statement&>(s));
    case statement_type::while_:                return v(static_cast<const while_statement&>(s));
    case statement_type::for_:                  return v(static_cast<const for_statement&>(s));
    case statement_type::for_in:                return v(static_cast<const for_in_statement&>(s));
    case statement_type::continue_:             return v(static_cast<const continue_statement&>(s));
    case statement_type::break_:                return v(static_cast<const break_statement&>(s));
    case statement_type::return_:               return v(static_cast<const return_statement&>(s));
    case statement_type::with:                  return v(static_cast<const with_statement&>(s));
    case statement_type::labelled:              return v(static_cast<const labelled_statement&>(s));
    case statement_type::switch_:               return v(static_cast<const switch_statement&>(s));
    case statement_type::throw_:                return v(static_cast<const throw_statement&>(s));
    case statement_type::try_:                  return v(static_cast<const try_statement&>(s));
    case statement_type::function_definition:   return v(static_cast<const function_definition&>(s));
    }
    assert(!"Not implemented");
    return v(s);
}